

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_easy *pCVar1;
  undefined4 *puVar2;
  CURLcode CVar3;
  long in_RAX;
  size_t len;
  char *pcVar4;
  bool bVar5;
  curltime cVar6;
  ssize_t bytes_written;
  long local_38;
  
  pCVar1 = conn->data;
  puVar2 = (undefined4 *)(pCVar1->req).protop;
  if (puVar2 == (undefined4 *)0x0) {
    return CURLE_OK;
  }
  if ((conn->proto).ftpc.pp.conn != (connectdata *)0x0) {
    local_38 = in_RAX;
    (*Curl_cfree)(*(void **)(puVar2 + 2));
    *(undefined8 *)(puVar2 + 2) = 0;
    if (status == CURLE_OK) {
      status = CURLE_OK;
      if ((((pCVar1->set).connect_only == false) && ((pCVar1->set).mail_rcpt != (curl_slist *)0x0))
         && (((pCVar1->set).upload != false || ((pCVar1->set).mimepost.kind != MIMEKIND_NONE)))) {
        if (*(char *)(puVar2 + 8) == '\0') {
          bVar5 = (conn->data->state).infilesize != 0;
          pcVar4 = "\r\n.\r\n";
          if (!bVar5) {
            pcVar4 = ".\r\n";
          }
          len = (ulong)bVar5 * 2 + 3;
        }
        else {
          len = 3;
          pcVar4 = ".\r\n";
        }
        pcVar4 = (*Curl_cstrdup)(pcVar4);
        if (pcVar4 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        CVar3 = Curl_write(conn,conn->writesockfd,pcVar4,len,&local_38);
        if (CVar3 != CURLE_OK) {
          (*Curl_cfree)(pcVar4);
          return CVar3;
        }
        if (len - local_38 == 0) {
          cVar6 = Curl_now();
          (conn->proto).smbc.send_size = cVar6.tv_sec;
          *(int *)((long)&conn->proto + 0x48) = cVar6.tv_usec;
          (*Curl_cfree)(pcVar4);
        }
        else {
          (conn->proto).ftpc.pp.sendthis = pcVar4;
          (conn->proto).smbc.upload_size = len;
          (conn->proto).ftpc.pp.sendleft = len - local_38;
        }
        (conn->proto).imapc.state = IMAP_APPEND;
        status = smtp_block_statemach(conn,false);
      }
    }
    else {
      Curl_conncontrol(conn,1);
    }
    *puVar2 = 0;
    return status;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  struct pingpong *pp = &conn->proto.smtpc.pp;
  char *eob;
  ssize_t len;
  ssize_t bytes_written;

  (void)premature;

  if(!smtp || !pp->conn)
    return CURLE_OK;

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.mail_rcpt &&
          (data->set.upload || data->set.mimepost.kind)) {
    /* Calculate the EOB taking into account any terminating CRLF from the
       previous line of the email or the CRLF of the DATA command when there
       is "no mail data". RFC-5321, sect. 4.1.1.4.

       Note: As some SSL backends, such as OpenSSL, will cause Curl_write() to
       fail when using a different pointer following a previous write, that
       returned CURLE_AGAIN, we duplicate the EOB now rather than when the
       bytes written doesn't equal len. */
    if(smtp->trailing_crlf || !conn->data->state.infilesize) {
      eob = strdup(SMTP_EOB + 2);
      len = SMTP_EOB_LEN - 2;
    }
    else {
      eob = strdup(SMTP_EOB);
      len = SMTP_EOB_LEN;
    }

    if(!eob)
      return CURLE_OUT_OF_MEMORY;

    /* Send the end of block data */
    result = Curl_write(conn, conn->writesockfd, eob, len, &bytes_written);
    if(result) {
      free(eob);
      return result;
    }

    if(bytes_written != len) {
      /* The whole chunk was not sent so keep it around and adjust the
         pingpong structure accordingly */
      pp->sendthis = eob;
      pp->sendsize = len;
      pp->sendleft = len - bytes_written;
    }
    else {
      /* Successfully sent so adjust the response timeout relative to now */
      pp->response = Curl_now();

      free(eob);
    }

    state(conn, SMTP_POSTDATA);

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the smtp_multi_statemach function but we have no general support for
       non-blocking DONE operations!
    */
    result = smtp_block_statemach(conn, FALSE);
  }

  /* Clear the transfer mode for the next request */
  smtp->transfer = FTPTRANSFER_BODY;

  return result;
}